

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O2

void cppqc::detail::TupleGeneratorHelper_shrink<0,Rectangle>::
     appendShrinks<std::tuple<cppqc::Generator<Rectangle>>>
               (tuple<Rectangle> *shrinkInput,
               vector<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_> *shrinkOutput,
               tuple<cppqc::Generator<Rectangle>_> *generators)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  _Var1;
  Rectangle *localShrink;
  pointer pRVar2;
  vector<Rectangle,_std::allocator<Rectangle>_> allLocalShrinks;
  Rectangle local_40;
  _Vector_base<Rectangle,_std::allocator<Rectangle>_> local_38;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl =
       (generators->super__Tuple_impl<0UL,_cppqc::Generator<Rectangle>_>).
       super__Head_base<0UL,_cppqc::Generator<Rectangle>,_false>._M_head_impl.m_gen._M_t.
       super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
                        .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>.
                        _M_head_impl + 0x18))
            (&local_38,
             _Var1._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl,
             shrinkInput);
  for (pRVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
      pRVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; pRVar2 = pRVar2 + 1) {
    local_40 = *pRVar2;
    std::vector<std::tuple<Rectangle>,std::allocator<std::tuple<Rectangle>>>::
    emplace_back<std::tuple<Rectangle>>
              ((vector<std::tuple<Rectangle>,std::allocator<std::tuple<Rectangle>>> *)shrinkOutput,
               (tuple<Rectangle> *)&local_40);
  }
  std::_Vector_base<Rectangle,_std::allocator<Rectangle>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }